

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadhb.c
# Opt level: O3

int sParseFloatFormat(char *buf,int *num,int *size)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  
  do {
    bVar1 = *buf;
    buf = (char *)((byte *)buf + 1);
  } while (bVar1 != 0x28);
  iVar2 = atoi(buf);
  *num = iVar2;
LAB_00107caa:
  do {
    uVar3 = (byte)*buf - 0x44;
    if (uVar3 < 0x2d) {
      if ((0x100000001000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        buf = (char *)((byte *)buf + 1);
        iVar2 = atoi(buf);
        *num = iVar2;
        goto LAB_00107caa;
      }
      if ((0x700000007U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        for (pbVar4 = (byte *)buf + 1; (*pbVar4 != 0x29 && (*pbVar4 != 0x2e)); pbVar4 = pbVar4 + 1)
        {
        }
        *pbVar4 = 0;
        iVar2 = atoi((char *)((byte *)buf + 1));
        *size = iVar2;
        return 0;
      }
    }
    buf = (char *)((byte *)buf + 1);
  } while( true );
}

Assistant:

int sParseFloatFormat(char *buf, int *num, int *size)
{
    char *tmp, *period;
    
    tmp = buf;
    while (*tmp++ != '(') ;
    *num = atoi(tmp); /*sscanf(tmp, "%d", num);*/
    while (*tmp != 'E' && *tmp != 'e' && *tmp != 'D' && *tmp != 'd'
	   && *tmp != 'F' && *tmp != 'f') {
        /* May find kP before nE/nD/nF, like (1P6F13.6). In this case the
           num picked up refers to P, which should be skipped. */
        if (*tmp=='p' || *tmp=='P') {
           ++tmp;
           *num = atoi(tmp); /*sscanf(tmp, "%d", num);*/
        } else {
           ++tmp;
        }
    }
    ++tmp;
    period = tmp;
    while (*period != '.' && *period != ')') ++period ;
    *period = '\0';
    *size = atoi(tmp); /*sscanf(tmp, "%2d", size);*/

    return 0;
}